

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O2

bool __thiscall ON_3dmRevisionHistory::IsValid(ON_3dmRevisionHistory *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = LastEditedTimeIsSet(this);
  if (bVar1) {
    iVar2 = ON_CompareRevisionHistoryTime(&this->m_create_time,&this->m_last_edit_time);
    bVar1 = iVar2 < 1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_3dmRevisionHistory::IsValid() const
{
  return (     LastEditedTimeIsSet() 
            && ON_CompareRevisionHistoryTime(&m_create_time, &m_last_edit_time) <= 0
         );
}